

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::TokenStream::loadBuffer(TokenStream *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  size_t i;
  string opt;
  size_type delimiterPos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next;
  value_type *in_stack_fffffffffffffe88;
  value_type *__x;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
  *in_stack_fffffffffffffe90;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  size_type in_stack_fffffffffffffea8;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
  *in_stack_fffffffffffffeb0;
  byte local_129;
  string local_118 [32];
  undefined4 local_f8;
  string local_f0 [32];
  undefined4 local_d0;
  string local_c8 [32];
  ulong local_a8;
  allocator local_99;
  string local_98 [32];
  undefined4 local_78;
  undefined1 local_70 [48];
  undefined4 local_40;
  undefined1 local_38 [32];
  long local_18;
  reference local_10;
  
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::resize
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe88);
    local_129 = 0;
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(in_RDI);
      local_129 = ::std::__cxx11::string::empty();
    }
    if ((local_129 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(in_RDI);
  }
  bVar2 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe90,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe88);
  if (bVar2) {
    local_10 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(in_RDI);
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_10);
    bVar2 = isOptPrefix(*pcVar3);
    if (bVar2) {
      local_18 = ::std::__cxx11::string::find_first_of((char *)local_10,0x209c5c);
      if (local_18 == -1) {
        pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_10);
        if ((*pcVar3 == '-') || (uVar4 = ::std::__cxx11::string::size(), uVar4 < 3)) {
          this_00 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                     *)(in_RDI + 2);
          local_f8 = 0;
          ::std::__cxx11::string::string(local_f0,(string *)local_10);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          push_back(this_00,in_stack_fffffffffffffe88);
          Token::~Token((Token *)0x1647b0);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_98,"- ",&local_99);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
          local_a8 = 1;
          while (uVar4 = local_a8, uVar5 = ::std::__cxx11::string::size(), uVar4 < uVar5) {
            puVar6 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_10);
            uVar1 = *puVar6;
            puVar6 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_98);
            *puVar6 = uVar1;
            local_d0 = 0;
            ::std::__cxx11::string::string(local_c8,local_98);
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            Token::~Token((Token *)0x1646c5);
            local_a8 = local_a8 + 1;
          }
          ::std::__cxx11::string::~string(local_98);
        }
      }
      else {
        local_40 = 0;
        ::std::__cxx11::string::substr((ulong)local_38,(ulong)local_10);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        Token::~Token((Token *)0x1644dd);
        local_78 = 1;
        ::std::__cxx11::string::substr((ulong)local_70,(ulong)local_10);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        Token::~Token((Token *)0x16453e);
      }
    }
    else {
      __x = (value_type *)(in_RDI + 2);
      ::std::__cxx11::string::string(local_118,(string *)local_10);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      push_back(in_stack_fffffffffffffe90,__x);
      Token::~Token((Token *)0x16481a);
    }
  }
  return;
}

Assistant:

void loadBuffer() {
            m_tokenBuffer.resize( 0 );

            // Skip any empty strings
            while( it != itEnd && it->empty() )
                ++it;

            if( it != itEnd ) {
                auto const &next = *it;
                if( isOptPrefix( next[0] ) ) {
                    auto delimiterPos = next.find_first_of( " :=" );
                    if( delimiterPos != std::string::npos ) {
                        m_tokenBuffer.push_back( { TokenType::Option, next.substr( 0, delimiterPos ) } );
                        m_tokenBuffer.push_back( { TokenType::Argument, next.substr( delimiterPos + 1 ) } );
                    } else {
                        if( next[1] != '-' && next.size() > 2 ) {
                            std::string opt = "- ";
                            for( size_t i = 1; i < next.size(); ++i ) {
                                opt[1] = next[i];
                                m_tokenBuffer.push_back( { TokenType::Option, opt } );
                            }
                        } else {
                            m_tokenBuffer.push_back( { TokenType::Option, next } );
                        }
                    }
                } else {
                    m_tokenBuffer.push_back( { TokenType::Argument, next } );
                }
            }
        }